

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::Program::Print(Program *this,DebugWriter *w)

{
  Type TVar1;
  code *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  EquivScannerMixinT<1U> *pEVar11;
  byte bVar12;
  bool bVar13;
  int iVar14;
  ulong uVar15;
  undefined4 *puVar16;
  Label LVar17;
  char16_t *pcVar18;
  char16_t *form;
  NopInst *actualInst;
  SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this_00;
  Label LVar19;
  Label LVar20;
  ulong uVar21;
  
  bVar12 = DAT_015aa300;
  uVar15 = 0;
  DebugWriter::PrintEOL(w,L"Program {");
  DebugWriter::Indent(w);
  DebugWriter::PrintEOL(w,L"source:       %s",(this->source).ptr);
  DebugWriter::Print(w,L"litbuf:       ");
  pcVar18 = (this->rep).insts.litbuf.ptr;
  if (pcVar18 == (char16_t *)0x0) {
    form = L"<NONE>";
  }
  else {
    uVar15 = (ulong)(this->rep).insts.litbufLen;
    form = L"";
    if (uVar15 != 0) {
      uVar21 = 0;
      do {
        DebugWriter::PrintEscapedChar(w,pcVar18[uVar21]);
        uVar21 = uVar21 + 1;
      } while (uVar15 != uVar21);
    }
  }
  DebugWriter::PrintEOL(w,form);
  DebugWriter::PrintEOL(w,L"litbufLen:    %u",uVar15);
  DebugWriter::Print(w,L"flags:        ");
  if ((this->flags & GlobalRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"global ");
  }
  if ((this->flags & MultilineRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"multiline ");
  }
  if ((this->flags & IgnoreCaseRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"ignorecase ");
  }
  if ((this->flags & DotAllRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"dotAll ");
  }
  if ((this->flags & UnicodeRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"unicode ");
  }
  if ((this->flags & StickyRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"sticky ");
  }
  DebugWriter::EOL(w);
  DebugWriter::PrintEOL(w,L"numGroups:    %d",(ulong)this->numGroups);
  DebugWriter::PrintEOL(w,L"numLoops:     %d",(ulong)(uint)this->numLoops);
  switch(this->tag) {
  case InstructionsTag:
  case BOIInstructionsTag:
    DebugWriter::PrintEOL(w,L"instructions: {");
    DebugWriter::Indent(w);
    if (this->tag == BOIInstructionsTag) {
      DebugWriter::PrintEOL(w,L"       BOITest(hardFail: true)");
    }
    uVar15 = (ulong)(this->rep).insts.instsLen;
    if (uVar15 != 0) {
      this_00 = *(SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> **)&this->rep;
      pEVar11 = &this_00->super_EquivScannerMixinT<1U>;
      LVar19 = 0;
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        TVar1 = (this_00->super_Inst).tag;
        if (EndAssertion < TVar1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar13 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                              ,0x16bb,"(false)","false");
          if (!bVar13) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar16 = 0;
          goto LAB_00efd6c5;
        }
        iVar14 = (int)this_00;
        uVar3 = (uint)bVar12;
        uVar4 = (uint)bVar12;
        uVar5 = (uint)bVar12;
        uVar6 = (uint)bVar12;
        uVar7 = (uint)bVar12;
        uVar8 = (uint)bVar12;
        uVar9 = (uint)bVar12;
        uVar10 = (uint)bVar12;
        switch(TVar1) {
        case Nop:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          NopInst::Print((NopInst *)this_00,w,LVar17,(Char *)&switchD_00efc4df::switchdataD_011c1250
                        );
          goto LAB_00efd6bf;
        case Fail:
          LVar20 = LVar19 + uVar5;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          FailInst::Print((FailInst *)this_00,w,LVar17,
                          (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd6bf;
        case Succ:
          LVar20 = LVar19 + uVar5;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          SuccInst::Print((SuccInst *)this_00,w,LVar17,
                          (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd6bf;
        case Jump:
          LVar20 = LVar19 + uVar5;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          JumpInst::Print((JumpInst *)this_00,w,LVar17,
                          (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case JumpIfNotChar:
          LVar20 = LVar19 + uVar4;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar17 = LVar19;
          }
          JumpIfNotCharInst::Print
                    ((JumpIfNotCharInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd5be;
        case MatchCharOrJump:
          LVar20 = LVar19 + uVar7;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar17 = LVar19;
          }
          MatchCharOrJumpInst::Print
                    ((MatchCharOrJumpInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd5be;
        case JumpIfNotSet:
          LVar20 = LVar19 + uVar7;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar17 = LVar19;
          }
          JumpIfNotSetInst::Print
                    ((JumpIfNotSetInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd694;
        case MatchSetOrJump:
          LVar20 = LVar19 + uVar5;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          MatchSetOrJumpInst::Print
                    ((MatchSetOrJumpInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd694;
        case Switch2:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          Switch2Inst::Print((Switch2Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd0c7;
        case Switch4:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          Switch4Inst::Print((Switch4Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efcc34;
        case Switch8:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar6 != 0) {
            LVar17 = LVar19;
          }
          Switch8Inst::Print((Switch8Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd095;
        case Switch16:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          Switch16Inst::Print((Switch16Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efcac8;
        case Switch24:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar17 = LVar19;
          }
          Switch24Inst::Print((Switch24Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efce4c;
        case SwitchAndConsume2:
          LVar20 = LVar19 + uVar7;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar17 = LVar19;
          }
          SwitchAndConsume2Inst::Print
                    ((SwitchAndConsume2Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd0c7;
        case SwitchAndConsume4:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          SwitchAndConsume4Inst::Print
                    ((SwitchAndConsume4Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
LAB_00efcc34:
          LVar19 = LVar19 + bVar12;
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + 1) + 1);
          break;
        case SwitchAndConsume8:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          SwitchAndConsume8Inst::Print
                    ((SwitchAndConsume8Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
LAB_00efd095:
          LVar19 = LVar19 + bVar12;
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.defv + 1);
          break;
        case SwitchAndConsume16:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          SwitchAndConsume16Inst::Print
                    ((SwitchAndConsume16Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
LAB_00efcac8:
          LVar19 = LVar19 + bVar12;
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 0x2d);
          break;
        case SwitchAndConsume24:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar17 = LVar19;
          }
          SwitchAndConsume24Inst::Print
                    ((SwitchAndConsume24Inst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
LAB_00efce4c:
          LVar19 = LVar19 + bVar12;
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 0x5d);
          break;
        case BOIHardFailTest:
          LVar20 = LVar19 + uVar7;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = BOITestInst<true>::Print
                             ((BOITestInst<true> *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case BOITest:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = BOITestInst<false>::Print
                             ((BOITestInst<false> *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case EOIHardFailTest:
          LVar20 = LVar19 + uVar6;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar6 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = EOITestInst<true>::Print
                             ((EOITestInst<true> *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case EOITest:
          LVar20 = LVar19 + uVar7;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = EOITestInst<false>::Print
                             ((EOITestInst<false> *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case BOLTest:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          BOLTestInst::Print((BOLTestInst *)this_00,w,LVar17,
                             (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd6bf;
        case EOLTest:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          EOLTestInst::Print((EOLTestInst *)this_00,w,LVar17,
                             (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd6bf;
        case NegatedWordBoundaryTest:
          LVar20 = LVar19 + uVar5;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = WordBoundaryTestInst<true>::Print
                             ((WordBoundaryTestInst<true> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case WordBoundaryTest:
          LVar20 = LVar19 + uVar4;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = WordBoundaryTestInst<false>::Print
                             ((WordBoundaryTestInst<false> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case MatchChar:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          MatchCharInst::Print
                    ((MatchCharInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd47c;
        case MatchChar2:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          MatchChar2Inst::Print
                    ((MatchChar2Inst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case MatchChar3:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          MatchChar3Inst::Print
                    ((MatchChar3Inst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd5be;
        case MatchChar4:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          MatchChar4Inst::Print
                    ((MatchChar4Inst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd346;
        case MatchSet:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = MatchSetInst<false>::Print
                             ((MatchSetInst<false> *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case MatchNegatedSet:
          LVar20 = LVar19 + uVar5;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = MatchSetInst<true>::Print
                             ((MatchSetInst<true> *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case MatchLiteral:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          MatchLiteralInst::Print((MatchLiteralInst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr)
          ;
          goto LAB_00efd346;
        case MatchLiteralEquiv:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          MatchLiteralEquivInst::Print
                    ((MatchLiteralEquivInst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd346;
        case MatchTrie:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          MatchTrieInst::Print
                    ((MatchTrieInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence;
          LVar19 = LVar19 + uVar3;
          break;
        case OptMatchChar:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          OptMatchCharInst::Print
                    ((OptMatchCharInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd47c;
        case OptMatchSet:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          OptMatchSetInst::Print
                    ((OptMatchSetInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence.isInMap.data + 3);
          LVar19 = LVar19 + uVar3;
          break;
        case SyncToCharAndContinue:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          SyncToCharAndContinueInst::Print
                    ((SyncToCharAndContinueInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd47c;
        case SyncToChar2SetAndContinue:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          SyncToChar2SetAndContinueInst::Print
                    ((SyncToChar2SetAndContinueInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case SyncToSetAndContinue:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = SyncToSetAndContinueInst<false>::Print
                             ((SyncToSetAndContinueInst<false> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case SyncToNegatedSetAndContinue:
          LVar20 = LVar19 + uVar4;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = SyncToSetAndContinueInst<true>::Print
                             ((SyncToSetAndContinueInst<true> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case SyncToChar2LiteralAndContinue:
          LVar20 = LVar19 + uVar6;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar6 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                    ((SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin> *)
                     this_00,w,LVar17,(Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case SyncToLiteralAndContinue:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
          ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                   *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd538;
        case SyncToLinearLiteralAndContinue:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
          ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                   *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd44e;
        case SyncToLiteralEquivAndContinue:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                    ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)this_00
                     ,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd538;
        case SyncToLiteralEquivTrivialLastPatCharAndContinue:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                    ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)this_00
                     ,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd538;
        case SyncToCharAndConsume:
          LVar20 = LVar19 + uVar9;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar17 = LVar19;
          }
          SyncToCharAndConsumeInst::Print
                    ((SyncToCharAndConsumeInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
LAB_00efd47c:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.
                            super_LiteralMixin.offset + 2);
          LVar19 = LVar20;
          break;
        case SyncToChar2SetAndConsume:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          SyncToChar2SetAndConsumeInst::Print
                    ((SyncToChar2SetAndConsumeInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case SyncToSetAndConsume:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = SyncToSetAndConsumeInst<false>::Print
                             ((SyncToSetAndConsumeInst<false> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case SyncToNegatedSetAndConsume:
          LVar20 = LVar19 + uVar4;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = SyncToSetAndConsumeInst<true>::Print
                             ((SyncToSetAndConsumeInst<true> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case SyncToChar2LiteralAndConsume:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                    ((SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin> *)this_00
                     ,w,LVar17,(Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case SyncToLiteralAndConsume:
          LVar20 = LVar19 + uVar9;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
          ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                   *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd538;
        case SyncToLinearLiteralAndConsume:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
          ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                   *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
LAB_00efd44e:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence.directMap + 1);
          LVar19 = LVar19 + bVar12;
          break;
        case SyncToLiteralEquivAndConsume:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                    ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)this_00,
                     w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd538;
        case SyncToLiteralEquivTrivialLastPatCharAndConsume:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                    ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)this_00,
                     w,LVar17,(this->rep).insts.litbuf.ptr);
LAB_00efd538:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &this_00->super_BackupMixin;
          LVar19 = LVar20;
          break;
        case SyncToCharAndBackup:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          SyncToCharAndBackupInst::Print
                    ((SyncToCharAndBackupInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd636;
        case SyncToSetAndBackup:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = SyncToSetAndBackupInst<false>::Print
                             ((SyncToSetAndBackupInst<false> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case SyncToNegatedSetAndBackup:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = SyncToSetAndBackupInst<true>::Print
                             ((SyncToSetAndBackupInst<true> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case SyncToChar2LiteralAndBackup:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                    ((SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin> *)this_00,
                     w,LVar17,(Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.field_0x4;
          LVar19 = LVar19 + uVar3;
          break;
        case SyncToLiteralAndBackup:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
          ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                   *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd2c1;
        case SyncToLinearLiteralAndBackup:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
          ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                   *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence.directMap + 3);
          LVar19 = LVar19 + uVar4;
          break;
        case SyncToLiteralEquivAndBackup:
          LVar20 = LVar19 + uVar7;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                    ((SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)this_00,w
                     ,LVar17,(this->rep).insts.litbuf.ptr);
          goto LAB_00efd2c1;
        case SyncToLiteralEquivTrivialLastPatCharAndBackup:
          LVar20 = LVar19 + uVar7;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                    (this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
LAB_00efd2c1:
          this_00 = this_00 + 1;
          LVar19 = LVar20;
          break;
        case SyncToLiteralsAndBackup:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          SyncToLiteralsAndBackupInst::Print
                    ((SyncToLiteralsAndBackupInst *)this_00,w,LVar17,(this->rep).insts.litbuf.ptr);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data[0].word + 4);
          LVar19 = LVar19 + uVar5;
          break;
        case MatchGroup:
          LVar20 = LVar19 + uVar4;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar4 != 0) {
            LVar17 = LVar19;
          }
          MatchGroupInst::Print
                    ((MatchGroupInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case BeginDefineGroup:
          LVar20 = LVar19 + uVar7;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar7 != 0) {
            LVar17 = LVar19;
          }
          BeginDefineGroupInst::Print
                    ((BeginDefineGroupInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case EndDefineGroup:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          EndDefineGroupInst::Print
                    ((EndDefineGroupInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.
                            super_LiteralMixin.length + 1);
          LVar19 = LVar19 + uVar3;
          break;
        case DefineGroupFixed:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          DefineGroupFixedInst::Print
                    ((DefineGroupFixedInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.field_0x1;
          LVar19 = LVar19 + uVar3;
          break;
        case BeginLoop:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          BeginLoopInst::Print
                    ((BeginLoopInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd590;
        case RepeatLoop:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          RepeatLoopInst::Print
                    ((RepeatLoopInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case BeginLoopIfChar:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          BeginLoopIfCharInst::Print
                    ((BeginLoopIfCharInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + 1) + 4);
          LVar19 = LVar19 + uVar3;
          break;
        case BeginLoopIfSet:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          BeginLoopIfSetInst::Print
                    ((BeginLoopIfSetInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 0xe);
          LVar19 = LVar19 + uVar3;
          break;
        case RepeatLoopIfChar:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          RepeatLoopIfCharInst::Print
                    ((RepeatLoopIfCharInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case RepeatLoopIfSet:
          LVar20 = LVar19 + uVar9;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar17 = LVar19;
          }
          RepeatLoopIfSetInst::Print
                    ((RepeatLoopIfSetInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case BeginLoopFixed:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar17 = LVar19;
          }
          BeginLoopFixedInst::Print
                    ((BeginLoopFixedInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data[0].word + 6);
          LVar19 = LVar19 + uVar9;
          break;
        case RepeatLoopFixed:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          RepeatLoopFixedInst::Print
                    ((RepeatLoopFixedInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case LoopSet:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar6 != 0) {
            LVar17 = LVar19;
          }
          LoopSetInst::Print((LoopSetInst *)this_00,w,LVar17,
                             (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efced1;
        case LoopSetWithFollowFirst:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          LoopSetWithFollowFirstInst::Print
                    ((LoopSetWithFollowFirstInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 3);
          LVar19 = LVar19 + uVar3;
          break;
        case BeginLoopFixedGroupLastIteration:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar17 = LVar19;
          }
          BeginLoopFixedGroupLastIterationInst::Print
                    ((BeginLoopFixedGroupLastIterationInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
LAB_00efd590:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + 1) + 3);
          LVar19 = LVar19 + bVar12;
          break;
        case RepeatLoopFixedGroupLastIteration:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          RepeatLoopFixedGroupLastIterationInst::Print
                    ((RepeatLoopFixedGroupLastIterationInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case BeginGreedyLoopNoBacktrack:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          BeginGreedyLoopNoBacktrackInst::Print
                    ((BeginGreedyLoopNoBacktrackInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
LAB_00efd346:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner;
          LVar19 = LVar20;
          break;
        case RepeatGreedyLoopNoBacktrack:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          RepeatGreedyLoopNoBacktrackInst::Print
                    ((RepeatGreedyLoopNoBacktrackInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd4aa;
        case ChompCharStar:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = ChompCharInst<(UnifiedRegex::ChompMode)0>::Print
                             ((ChompCharInst<(UnifiedRegex::ChompMode)0> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case ChompCharPlus:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = ChompCharInst<(UnifiedRegex::ChompMode)1>::Print
                             ((ChompCharInst<(UnifiedRegex::ChompMode)1> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case ChompSetStar:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = ChompSetInst<(UnifiedRegex::ChompMode)0>::Print
                             ((ChompSetInst<(UnifiedRegex::ChompMode)0> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case ChompSetPlus:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = ChompSetInst<(UnifiedRegex::ChompMode)1>::Print
                             ((ChompSetInst<(UnifiedRegex::ChompMode)1> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case ChompCharGroupStar:
          LVar20 = LVar19 + uVar8;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar8 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Print
                             ((ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case ChompCharGroupPlus:
          LVar20 = LVar19 + uVar9;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = ChompCharGroupInst<(UnifiedRegex::ChompMode)1>::Print
                             ((ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case ChompSetGroupStar:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::Print
                             ((ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
          goto LAB_00efd668;
        case ChompSetGroupPlus:
          LVar20 = LVar19 + uVar10;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar10 != 0) {
            LVar17 = LVar19;
          }
          iVar14 = ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::Print
                             ((ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)this_00,w,LVar17,
                              (this->rep).insts.litbuf.ptr);
LAB_00efd668:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.isInMap.data + (long)iVar14 + -0x11);
          LVar19 = LVar20;
          break;
        case ChompCharBounded:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar17 = LVar19;
          }
          ChompCharBoundedInst::Print
                    ((ChompCharBoundedInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
LAB_00efd636:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.field_0x2;
          LVar19 = LVar19 + bVar12;
          break;
        case ChompSetBounded:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          ChompSetBoundedInst::Print
                    ((ChompSetBoundedInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                     lastOccurrence.defv;
          LVar19 = LVar19 + uVar3;
          break;
        case ChompSetBoundedGroupLastChar:
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          ChompSetBoundedGroupLastCharInst::Print
                    ((ChompSetBoundedGroupLastCharInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
LAB_00efced1:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                           lastOccurrence.directMap + 1);
          LVar19 = LVar19 + bVar12;
          break;
        case Try:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          TryInst::Print((TryInst *)this_00,w,LVar17,(Char *)&switchD_00efc4df::switchdataD_011c1250
                        );
LAB_00efd4aa:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.
                     length;
          LVar19 = LVar20;
          break;
        case TryIfChar:
          LVar20 = LVar19 + uVar5;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          TryIfCharInst::Print
                    ((TryIfCharInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd5be;
        case TryMatchChar:
          LVar20 = LVar19 + uVar9;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar9 != 0) {
            LVar17 = LVar19;
          }
          TryMatchCharInst::Print
                    ((TryMatchCharInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
LAB_00efd5be:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)&(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.
                            super_LiteralMixin.length + 2);
          LVar19 = LVar20;
          break;
        case TryIfSet:
          LVar20 = LVar19 + uVar3;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar3 != 0) {
            LVar17 = LVar19;
          }
          TryIfSetInst::Print((TryIfSetInst *)this_00,w,LVar17,
                              (Char *)&switchD_00efc4df::switchdataD_011c1250);
          goto LAB_00efd694;
        case TryMatchSet:
          LVar20 = LVar19 + uVar10;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar10 != 0) {
            LVar17 = LVar19;
          }
          TryMatchSetInst::Print
                    ((TryMatchSetInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
LAB_00efd694:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    ((long)((this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.
                            lastOccurrence.isInMap.data + 3) + 4);
          LVar19 = LVar20;
          break;
        case BeginAssertion:
          LVar20 = LVar19 + uVar5;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar5 != 0) {
            LVar17 = LVar19;
          }
          BeginAssertionInst::Print
                    ((BeginAssertionInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
LAB_00efd0c7:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &(this_00->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner.field_0x5;
          LVar19 = LVar20;
          break;
        case EndAssertion:
          LVar20 = LVar19 + uVar10;
          LVar17 = iVar14 - (this->rep).boiLiteral2.literal;
          if (uVar10 != 0) {
            LVar17 = LVar19;
          }
          EndAssertionInst::Print
                    ((EndAssertionInst *)this_00,w,LVar17,
                     (Char *)&switchD_00efc4df::switchdataD_011c1250);
LAB_00efd6bf:
          this_00 = (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
                    &this_00->super_EquivScannerMixinT<1U>;
          LVar19 = LVar20;
        }
LAB_00efd6c5:
      } while (this_00 !=
               (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)
               ((long)(pEVar11->super_ScannerMixin).scanner.lastOccurrence.isInMap.data +
               (uVar15 - 0x11)));
    }
    DebugWriter::Unindent(w);
    pcVar18 = L"}";
    break;
  default:
    goto switchD_00efc45c_caseD_2;
  case SingleCharTag:
    DebugWriter::Print(w,L"special form: <match single char ");
    DebugWriter::PrintQuotedChar(w,(this->rep).singleChar.c);
    goto LAB_00efd71d;
  case BoundedWordTag:
    pcVar18 = L"special form: <match bounded word>";
    break;
  case LeadingTrailingSpacesTag:
    DebugWriter::PrintEOL
              (w,L"special form: <match leading/trailing spaces: minBegin=%d minEnd=%d>",
               (ulong)(this->rep).boiLiteral2.literal,
               (ulong)(this->rep).leadingTrailingSpaces.endMinMatch);
    goto switchD_00efc45c_caseD_2;
  case OctoquadTag:
    DebugWriter::Print(w,L"special form: <octoquad ");
    OctoquadMatcher::Print((OctoquadMatcher *)(this->rep).insts.insts.ptr,w);
LAB_00efd71d:
    pcVar18 = L">";
  }
  DebugWriter::PrintEOL(w,pcVar18);
switchD_00efc45c_caseD_2:
  DebugWriter::Unindent(w);
  DebugWriter::PrintEOL(w,L"}");
  return;
}

Assistant:

void Program::Print(DebugWriter* w)
    {
        const bool isBaselineMode = Js::Configuration::Global.flags.BaselineMode;
        w->PrintEOL(_u("Program {"));
        w->Indent();
        w->PrintEOL(_u("source:       %s"), PointerValue(source));

        w->Print(_u("litbuf:       "));
        const char16 *litbuf = this->rep.insts.litbuf;
        size_t litbufLen = 0;
        if (litbuf == nullptr)
        {
            w->PrintEOL(_u("<NONE>"));
        }
        else
        {
            litbufLen = this->rep.insts.litbufLen;
            for (size_t i = 0; i < litbufLen; ++i)
            {
                const char16 c = (char16)litbuf[i];
                w->PrintEscapedChar(c);
            }
            w->PrintEOL(_u(""));
        }
        w->PrintEOL(_u("litbufLen:    %u"), litbufLen);

        w->Print(_u("flags:        "));
        if ((flags & GlobalRegexFlag) != 0) w->Print(_u("global "));
        if ((flags & MultilineRegexFlag) != 0) w->Print(_u("multiline "));
        if ((flags & IgnoreCaseRegexFlag) != 0) w->Print(_u("ignorecase "));
        if ((flags & DotAllRegexFlag) != 0) w->Print(_u("dotAll "));
        if ((flags & UnicodeRegexFlag) != 0) w->Print(_u("unicode "));
        if ((flags & StickyRegexFlag) != 0) w->Print(_u("sticky "));
        w->EOL();
        w->PrintEOL(_u("numGroups:    %d"), numGroups);
        w->PrintEOL(_u("numLoops:     %d"), numLoops);
        switch (tag)
        {
        case ProgramTag::BOIInstructionsTag:
        case ProgramTag::InstructionsTag:
            {
                w->PrintEOL(_u("instructions: {"));
                w->Indent();
                if (tag == ProgramTag::BOIInstructionsTag)
                {
                    w->PrintEOL(_u("       BOITest(hardFail: true)"));
                }
                uint8* instsLim = rep.insts.insts + rep.insts.instsLen;
                uint8* curr = rep.insts.insts;
                int i = 0;
                while (curr != instsLim)
                {
                    const Inst *inst = (const Inst*)curr;
                    switch (inst->tag)
                    {
#define MBase(TagName, ClassName) \
                    case Inst::InstTag::TagName: \
                    { \
                        const ClassName *actualInst = static_cast<const ClassName *>(inst); \
                        curr += actualInst->Print(w, (Label)(isBaselineMode ? i++ : curr - rep.insts.insts), rep.insts.litbuf); \
                        break; \
                    }
#define M(TagName) MBase(TagName, TagName##Inst)
#define MTemplate(TagName, TemplateDeclaration, GenericClassName, SpecializedClassName) MBase(TagName, SpecializedClassName)
#include "RegexOpCodes.h"
#undef MBase
#undef M
#undef MTemplate
                    default:
                        Assert(false);
                        __assume(false);
                    }
                }
                w->Unindent();
                w->PrintEOL(_u("}"));
            }
            break;
        case ProgramTag::SingleCharTag:
            w->Print(_u("special form: <match single char "));
            w->PrintQuotedChar(rep.singleChar.c);
            w->PrintEOL(_u(">"));
            break;
        case ProgramTag::BoundedWordTag:
            w->PrintEOL(_u("special form: <match bounded word>"));
            break;
        case ProgramTag::LeadingTrailingSpacesTag:
            w->PrintEOL(_u("special form: <match leading/trailing spaces: minBegin=%d minEnd=%d>"),
                rep.leadingTrailingSpaces.beginMinMatch, rep.leadingTrailingSpaces.endMinMatch);
            break;
        case ProgramTag::OctoquadTag:
            w->Print(_u("special form: <octoquad "));
            rep.octoquad.matcher->Print(w);
            w->PrintEOL(_u(">"));
            break;
        }
        w->Unindent();
        w->PrintEOL(_u("}"));
    }